

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

void http_parse_query(http_s *h)

{
  FIOBJ FVar1;
  void *pvVar2;
  char *cut2;
  char *cut;
  fio_str_info_s q;
  http_s *h_local;
  
  if (h->query != 0) {
    q.data = (char *)h;
    if (h->params == 0) {
      FVar1 = fiobj_hash_new();
      *(FIOBJ *)(q.data + 0x68) = FVar1;
    }
    fiobj_obj2cstr((fio_str_info_s *)&cut,*(FIOBJ *)(q.data + 0x50));
    do {
      cut2 = (char *)memchr((void *)q.len,0x26,q.capa);
      if (cut2 == (char *)0x0) {
        cut2 = (char *)(q.len + q.capa);
      }
      pvVar2 = memchr((void *)q.len,0x3d,(long)cut2 - q.len);
      if (pvVar2 != (void *)0x0) {
        http_add2hash(*(FIOBJ *)(q.data + 0x68),(char *)q.len,(long)pvVar2 - q.len,
                      (char *)((long)pvVar2 + 1),(long)cut2 - ((long)pvVar2 + 1),'\x01');
      }
      if (*cut2 == '&') {
        if ((((cut2[1] == 'a') && (cut2[2] == 'm')) && (cut2[3] == 'p')) && (cut2[4] == ';')) {
          cut2 = cut2 + 5;
        }
        else {
          cut2 = cut2 + 1;
        }
      }
      q.capa = q.capa - ((long)cut2 - q.len);
      q.len = (size_t)cut2;
    } while (q.capa != 0);
  }
  return;
}

Assistant:

void http_parse_query(http_s *h) {
  if (!h->query)
    return;
  if (!h->params)
    h->params = fiobj_hash_new();
  fio_str_info_s q = fiobj_obj2cstr(h->query);
  do {
    char *cut = memchr(q.data, '&', q.len);
    if (!cut)
      cut = q.data + q.len;
    char *cut2 = memchr(q.data, '=', (cut - q.data));
    if (cut2) {
      /* we only add named elements... */
      http_add2hash(h->params, q.data, (size_t)(cut2 - q.data), (cut2 + 1),
                    (size_t)(cut - (cut2 + 1)), 1);
    }
    if (cut[0] == '&') {
      /* protecting against some ...less informed... clients */
      if (cut[1] == 'a' && cut[2] == 'm' && cut[3] == 'p' && cut[4] == ';')
        cut += 5;
      else
        cut += 1;
    }
    q.len -= (uintptr_t)(cut - q.data);
    q.data = cut;
  } while (q.len);
}